

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O2

string * __thiscall
cmUuid::FromSha1(string *__return_storage_ptr__,cmUuid *this,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace,string *name)

{
  SHA_CTX *context;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashInput;
  uchar digest [20];
  
  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CreateHashInput((cmUuid *)__return_storage_ptr__,uuidNamespace,name,&hashInput);
  context = (SHA_CTX *)operator_new(0xd0);
  cmSHA1_Init(context);
  cmSHA1_Update(context,hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                (long)hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  digest[0] = '\0';
  digest[1] = '\0';
  digest[2] = '\0';
  digest[3] = '\0';
  digest[4] = '\0';
  digest[5] = '\0';
  digest[6] = '\0';
  digest[7] = '\0';
  digest[8] = '\0';
  digest[9] = '\0';
  digest[10] = '\0';
  digest[0xb] = '\0';
  digest[0xc] = '\0';
  digest[0xd] = '\0';
  digest[0xe] = '\0';
  digest[0xf] = '\0';
  digest[0x10] = '\0';
  digest[0x11] = '\0';
  digest[0x12] = '\0';
  digest[0x13] = '\0';
  cmSHA1_Final(digest,context);
  operator_delete(context,0xd0);
  FromDigest_abi_cxx11_(__return_storage_ptr__,this,digest,'\x05');
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::FromSha1(std::vector<unsigned char> const& uuidNamespace,
    std::string const& name) const
{
  std::vector<unsigned char> hashInput;
  this->CreateHashInput(uuidNamespace, name, hashInput);

  SHA_CTX *sha = new SHA_CTX;
  SHA1_Init(sha);
  SHA1_Update(sha, &hashInput[0], hashInput.size());

  unsigned char digest[SHA1_DIGEST_LENGTH] = {0};
  SHA1_Final(digest, sha);

  delete sha;

  return this->FromDigest(digest, 5);
}